

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O1

shared_ptr<const_Assimp::STEP::EXPRESS::LIST>
Assimp::STEP::EXPRESS::LIST::Parse(char **inout,uint64_t line,ConversionSchema *schema)

{
  char cVar1;
  char *c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  char *pcVar2;
  SyntaxError *pSVar3;
  ConversionSchema *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_type __n;
  shared_ptr<const_Assimp::STEP::EXPRESS::LIST> sVar4;
  char *local_70;
  undefined1 local_68 [32];
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined8 *local_38;
  
  local_48 = (element_type *)inout;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_008ff7a8;
  this[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[1]._M_use_count = 0;
  this[1]._M_weak_count = 0;
  this[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[2]._M_use_count = 0;
  this[2]._M_weak_count = 0;
  this[1]._vptr__Sp_counted_base = (_func_int **)&PTR__LIST_008ff7f8;
  this[1]._M_use_count = 0;
  this[1]._M_weak_count = 0;
  this[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[2]._M_use_count = 0;
  this[2]._M_weak_count = 0;
  local_70 = *(char **)line + 1;
  local_38 = (undefined8 *)line;
  if (**(char **)line != '(') {
    pSVar3 = (SyntaxError *)__cxa_allocate_exception(0x10);
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"unexpected token, expected \'(\' token at beginning of list","");
    SyntaxError::SyntaxError(pSVar3,(string *)local_68,(uint64_t)schema);
    __cxa_throw(pSVar3,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_40 = this + 1;
  __n = 1;
  for (pcVar2 = local_70; (cVar1 = *pcVar2, cVar1 != ')' && (cVar1 != '\0')); pcVar2 = pcVar2 + 1) {
    __n = __n + (cVar1 == ',');
  }
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::reserve((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             *)&this[1]._M_use_count,__n);
  if (*local_70 != '\0') {
    do {
      for (; (*local_70 == ' ' || (*local_70 == '\t')); local_70 = local_70 + 1) {
      }
      if (*local_70 == ')') {
LAB_0069d80e:
        *local_38 = local_70 + 1;
        (local_48->super_DataType)._vptr_DataType = (_func_int **)local_40;
        (local_48->members).
        super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        sVar4.super___shared_ptr<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = extraout_RDX._M_pi;
        sVar4.super___shared_ptr<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_48;
        return (shared_ptr<const_Assimp::STEP::EXPRESS::LIST>)
               sVar4.
               super___shared_ptr<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>;
      }
      DataType::Parse((DataType *)local_68,&local_70,(uint64_t)schema,in_RCX);
      std::
      vector<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>,std::allocator<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>>>
      ::emplace_back<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>>
                ((vector<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>,std::allocator<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>>>
                  *)&this[1]._M_use_count,
                 (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_68);
      pcVar2 = local_70;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
        pcVar2 = local_70;
      }
      for (; (*pcVar2 == ' ' || (*pcVar2 == '\t')); pcVar2 = pcVar2 + 1) {
      }
      if (*pcVar2 != ',') {
        local_70 = pcVar2;
        if (*pcVar2 != ')') {
          pSVar3 = (SyntaxError *)__cxa_allocate_exception(0x10);
          local_68._0_8_ = local_68 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_68,
                     "unexpected token, expected \',\' or \')\' token after list element","");
          SyntaxError::SyntaxError(pSVar3,(string *)local_68,(uint64_t)schema);
          __cxa_throw(pSVar3,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0069d80e;
      }
      local_70 = pcVar2 + 1;
    } while (pcVar2[1] != '\0');
  }
  pSVar3 = (SyntaxError *)__cxa_allocate_exception(0x10);
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"unexpected end of line while reading list","");
  SyntaxError::SyntaxError(pSVar3,(string *)local_68,0xffffffffffffffff);
  __cxa_throw(pSVar3,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<const EXPRESS::LIST> EXPRESS::LIST::Parse(const char*& inout,uint64_t line, const EXPRESS::ConversionSchema* schema /*= NULL*/) {
    const std::shared_ptr<EXPRESS::LIST> list = std::make_shared<EXPRESS::LIST>();
    EXPRESS::LIST::MemberList& members = list->members;

    const char* cur = inout;
    if (*cur++ != '(') {
        throw STEP::SyntaxError("unexpected token, expected \'(\' token at beginning of list",line);
    }

    // estimate the number of items upfront - lists can grow large
    size_t count = 1;
    for(const char* c=cur; *c && *c != ')'; ++c) {
        count += (*c == ',' ? 1 : 0);
    }

    members.reserve(count);

    for(;;++cur) {
        if (!*cur) {
            throw STEP::SyntaxError("unexpected end of line while reading list");
        }
        SkipSpaces(cur,&cur);
        if (*cur == ')') {
            break;
        }

        members.push_back( EXPRESS::DataType::Parse(cur,line,schema));
        SkipSpaces(cur,&cur);

        if (*cur != ',') {
            if (*cur == ')') {
                break;
            }
            throw STEP::SyntaxError("unexpected token, expected \',\' or \')\' token after list element",line);
        }
    }

    inout = cur+1;
    return list;
}